

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryVectors
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs)

{
  pointer puVar1;
  Index t;
  JointActionObservationHistoryTree *this_00;
  JointActionObservationHistory *this_01;
  ulong uVar2;
  ulong uVar3;
  value_type_conflict1 *jaIs_00;
  Index *joIs_00;
  Index *__x;
  bool bVar4;
  Index aIStack_40 [2];
  undefined1 *local_38;
  
  puVar1 = (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  aIStack_40[0] = 0x4643b3;
  aIStack_40[1] = 0;
  this_00 = GetJointActionObservationHistoryTree(this,jaohI);
  if (this_00 != (JointActionObservationHistoryTree *)0x0) {
    aIStack_40[0] = 0x4643c0;
    aIStack_40[1] = 0;
    this_01 = JointActionObservationHistoryTree::GetJointActionObservationHistory(this_00);
    JointActionObservationHistory::GetJointActionObservationHistoryVectors(this_01,jaIs,joIs);
    return;
  }
  aIStack_40[0] = 0x4643e7;
  aIStack_40[1] = 0;
  t = GetTimeStepForJAOHI(this,jaohI);
  uVar3 = (ulong)t;
  uVar2 = uVar3 * 4 + 0xf & 0xfffffffffffffff0;
  jaIs_00 = (value_type_conflict1 *)((long)&local_38 - uVar2);
  joIs_00 = (Index *)((long)jaIs_00 - uVar2);
  local_38 = (undefined1 *)&local_38;
  joIs_00[-2] = 0x46441f;
  joIs_00[-1] = 0;
  GetJointActionObservationHistoryArrays(this,jaohI,t,jaIs_00,joIs_00);
  __x = joIs_00;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    joIs_00[-2] = 0x464430;
    joIs_00[-1] = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(jaIs,jaIs_00);
    joIs_00[-2] = 0x46443b;
    joIs_00[-1] = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(joIs,__x);
    jaIs_00 = jaIs_00 + 1;
    __x = __x + 1;
  }
  return;
}

Assistant:

void
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryVectors
    (LIndex jaohI, vector<Index> &jaIs, vector<Index> &joIs) const
{
    jaIs.clear();
    joIs.clear();

    JointActionObservationHistoryTree* jaoht = 
        GetJointActionObservationHistoryTree(jaohI);
    // if it is not cached, jaoht will be set to 0
    if(jaoht)
    {
        jaoht->GetJointActionObservationHistory()->
            GetJointActionObservationHistoryVectors(jaIs, joIs);
    }
    else
    {    
        Index t = GetTimeStepForJAOHI(jaohI);
        Index jaIs_arr[t];
        Index joIs_arr[t];
        GetJointActionObservationHistoryArrays(jaohI, t, jaIs_arr, joIs_arr );
        for(size_t t2 = 0; t2 < t; t2++)
        {
            jaIs.push_back(jaIs_arr[t2]);
            joIs.push_back(joIs_arr[t2]);
        }
    }
}